

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.hh
# Opt level: O0

void __thiscall tinyusdz::ascii::AsciiParser::PushWarn(AsciiParser *this,string *msg)

{
  undefined1 local_40 [8];
  ErrorDiagnostic diag;
  string *msg_local;
  AsciiParser *this_local;
  
  diag.cursor = (Cursor)msg;
  ErrorDiagnostic::ErrorDiagnostic((ErrorDiagnostic *)local_40);
  diag.err.field_2._8_4_ = (this->_curr_cursor).row;
  diag.err.field_2._12_4_ = (this->_curr_cursor).col;
  ::std::__cxx11::string::operator=((string *)local_40,(string *)diag.cursor);
  ::std::
  stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>_>
  ::push(&this->warn_stack,(value_type *)local_40);
  ErrorDiagnostic::~ErrorDiagnostic((ErrorDiagnostic *)local_40);
  return;
}

Assistant:

void PushWarn(const std::string &msg) {
    ErrorDiagnostic diag;
    diag.cursor.row = _curr_cursor.row;
    diag.cursor.col = _curr_cursor.col;
    diag.err = msg;
    warn_stack.push(diag);
  }